

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O3

void ftruncate_cb(uv_fs_t *req)

{
  int iVar1;
  
  if (req == &ftruncate_req) {
    if (ftruncate_req.fs_type != UV_FS_FTRUNCATE) goto LAB_00163663;
    if (ftruncate_req.result == 0) {
      ftruncate_cb_count = ftruncate_cb_count + 1;
      uv_fs_req_cleanup(&ftruncate_req);
      iVar1 = uv_fs_close(loop,&close_req,(undefined4)open_req1.result,close_cb);
      if (iVar1 == 0) {
        return;
      }
      goto <EXTERNAL>_uv_signal_stop;
    }
  }
  else {
    ftruncate_cb_cold_1();
LAB_00163663:
    ftruncate_cb_cold_2();
  }
  ftruncate_cb_cold_3();
<EXTERNAL>_uv_signal_stop:
  ftruncate_cb_cold_4();
  uv_signal_stop();
  return;
}

Assistant:

static void ftruncate_cb(uv_fs_t* req) {
  int r;
  ASSERT(req == &ftruncate_req);
  ASSERT(req->fs_type == UV_FS_FTRUNCATE);
  ASSERT(req->result == 0);
  ftruncate_cb_count++;
  uv_fs_req_cleanup(req);
  r = uv_fs_close(loop, &close_req, open_req1.result, close_cb);
  ASSERT(r == 0);
}